

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldMap.cpp
# Opt level: O0

void __thiscall FIX::FieldMap::~FieldMap(FieldMap *this)

{
  FieldMap *this_local;
  
  ~FieldMap(this);
  operator_delete(this,0x70);
  return;
}

Assistant:

FieldMap::~FieldMap() { clear(); }